

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChMatterSPH::VariablesFbIncrementMq(ChMatterSPH *this)

{
  pointer psVar1;
  ChVariablesNode *this_00;
  uint uVar2;
  ulong uVar3;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> RStack_88;
  ChVectorRef local_60;
  ChVectorRef local_48;
  
  uVar2 = 0;
  while( true ) {
    psVar1 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (ulong)uVar2;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar3)
    break;
    this_00 = &(psVar1[uVar3].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->variables;
    ChVariables::Get_fb(&local_48,&this_00->super_ChVariables);
    ChVariables::Get_qb(&local_60,
                        &(((this->nodes).
                           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar3].
                           super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->variables).super_ChVariables);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&RStack_88,
               &local_60.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              );
    ChVariablesNode::Compute_inc_Mb_v(this_00,&local_48,&RStack_88);
    Eigen::internal::handmade_aligned_free
              (RStack_88.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void ChMatterSPH::VariablesFbIncrementMq() {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->variables.Compute_inc_Mb_v(nodes[j]->variables.Get_fb(), nodes[j]->variables.Get_qb());
    }
}